

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O1

void QOpenGL2PaintEngineExPrivate::cleanupVectorPath(QPaintEngineEx *engine,void *data)

{
  free(*data);
  free(*(void **)((long)data + 8));
  operator_delete(data,0x30);
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::cleanupVectorPath(QPaintEngineEx *engine, void *data)
{
    QOpenGL2PEVectorPathCache *c = (QOpenGL2PEVectorPathCache *) data;
#ifdef QT_OPENGL_CACHE_AS_VBOS
    Q_ASSERT(engine->type() == QPaintEngine::OpenGL2);
    static_cast<QOpenGL2PaintEngineEx *>(engine)->d_func()->unusedVBOSToClean << c->vbo;
    if (c->ibo)
        d->unusedIBOSToClean << c->ibo;
#else
    Q_UNUSED(engine);
    free(c->vertices);
    free(c->indices);
#endif
    delete c;
}